

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O0

void __thiscall SelectiveBranchingMT::task_data::~task_data(task_data *this)

{
  string *this_00;
  long in_RDI;
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *in_stack_ffffffffffffffe0;
  
  v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::delete_v
            ((v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_> *)
             in_stack_ffffffffffffffe0);
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::delete_v(in_stack_ffffffffffffffe0);
  v_array<std::pair<unsigned_int,_float>_>::delete_v
            ((v_array<std::pair<unsigned_int,_float>_> *)in_stack_ffffffffffffffe0);
  if ((*(long *)(in_RDI + 0x80) != 0) &&
     (this_00 = *(string **)(in_RDI + 0x80), this_00 != (string *)0x0)) {
    std::__cxx11::string::~string(this_00);
    operator_delete(this_00);
  }
  if ((*(long *)(in_RDI + 0x88) != 0) && (*(long **)(in_RDI + 0x88) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x88) + 8))();
  }
  return;
}

Assistant:

~task_data()
  {
    branches.delete_v();
    final.delete_v();
    trajectory.delete_v();
    if (output_string)
      delete output_string;
    if (kbest_out)
      delete kbest_out;
  }